

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

Instr * __thiscall
IR::Instr::HoistSrc1(Instr *this,OpCode assignOpcode,RegNum regNum,StackSym *newSym)

{
  IRType type;
  undefined2 valueType;
  bool bVar1;
  Opnd *src1Opnd;
  StackSym *sym;
  RegOpnd *pRVar2;
  Opnd *this_00;
  Instr *instr;
  
  src1Opnd = UnlinkSrc1(this);
  type = src1Opnd->m_type;
  sym = newSym;
  if (newSym == (StackSym *)0x0) {
    sym = StackSym::New(type,this->m_func);
  }
  pRVar2 = RegOpnd::New(sym,regNum,type,this->m_func);
  this_00 = SetSrc1(this,&pRVar2->super_Opnd);
  valueType = src1Opnd->m_valueType;
  Opnd::SetValueType(this_00,(ValueType)valueType);
  instr = New(assignOpcode,this_00,src1Opnd,this->m_func);
  InsertBefore(this,instr);
  if (newSym == (StackSym *)0x0) {
    bVar1 = Opnd::IsRegOpnd(src1Opnd);
    if (bVar1) {
      pRVar2 = Opnd::AsRegOpnd(src1Opnd);
      StackSym::CopySymAttrs(sym,pRVar2->m_sym);
    }
    else {
      bVar1 = Opnd::IsImmediateOpnd(src1Opnd);
      if (bVar1) {
        StackSym::SetIsConst(sym);
      }
    }
  }
  return instr;
}

Assistant:

Instr *
Instr::HoistSrc1(Js::OpCode assignOpcode, RegNum regNum, StackSym *newSym)
{
    Opnd *oldSrc, *newSrc;
    Instr * newInstr;
    IRType type;

    oldSrc = this->UnlinkSrc1();
    type = oldSrc->GetType();

    const bool creatingNewSym = !newSym;
    if(creatingNewSym)
    {
        newSym = StackSym::New(type, m_func);
    }
    newSrc = this->SetSrc1(RegOpnd::New(newSym, regNum, type, m_func));
    newSrc->SetValueType(oldSrc->GetValueType());

    newInstr = Instr::New(assignOpcode, newSrc, oldSrc, m_func);
    this->InsertBefore(newInstr);

    if(creatingNewSym)
    {
        if (oldSrc->IsRegOpnd())
        {
            newSym->CopySymAttrs(oldSrc->AsRegOpnd()->m_sym);
        }
        else if (oldSrc->IsImmediateOpnd())
        {
            newSym->SetIsConst();
        }
    }

    return newInstr;
}